

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::Phi(DiffuseAreaLight *this,SampledWavelengths *lambda)

{
  Image *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Tuple2<pbrt::Point2,_int> TVar6;
  RGB *pRVar7;
  ulong uVar8;
  long lVar9;
  int c;
  int c_00;
  Point2i p;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar17;
  undefined1 local_b0 [8];
  undefined1 auStack_a8 [8];
  SampledSpectrum local_a0;
  long local_90;
  DiffuseAreaLight *local_88;
  ulong local_80;
  ulong local_78;
  WrapMode2D local_70;
  SampledSpectrum local_68;
  RGBSpectrum local_58;
  undefined1 auVar16 [56];
  
  auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
  SampledSpectrum::SampledSpectrum(&local_a0,0.0);
  auVar16 = auVar10._8_56_;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    SVar17 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar12._0_8_ = SVar17.values.values._0_8_;
    auVar12._8_56_ = auVar16;
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_8_ = SVar17.values.values._8_8_;
    local_a0.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar5);
  }
  else {
    TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    this_00 = &this->image;
    lVar9 = 0;
    local_88 = this;
    while (lVar9 < (long)TVar6 >> 0x20) {
      local_80 = lVar9 << 0x20;
      uVar8 = 0;
      local_90 = lVar9;
      while ((long)uVar8 < (long)TVar6.x) {
        _local_b0 = (RGB)ZEXT812(0);
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_80 | uVar8);
        local_78 = uVar8;
        for (c_00 = 0; this = local_88, auVar16 = auVar10._8_56_, c_00 != 3; c_00 = c_00 + 1) {
          WrapMode2D::WrapMode2D(&local_70,Clamp);
          auVar10._0_4_ = Image::GetChannel(this_00,p,c_00,local_70);
          auVar10._4_60_ = extraout_var;
          pRVar7 = (RGB *)local_b0;
          if ((c_00 != 0) && (pRVar7 = (RGB *)(local_b0 + 4), c_00 != 1)) {
            pRVar7 = (RGB *)(local_b0 + 8);
          }
          pRVar7->r = auVar10._0_4_;
        }
        RGBSpectrum::RGBSpectrum(&local_58,local_88->imageColorSpace,(RGB *)local_b0);
        SVar17 = RGBSpectrum::Sample(&local_58,lambda);
        auVar11._0_8_ = SVar17.values.values._0_8_;
        auVar11._8_56_ = auVar16;
        auVar1._8_8_ = in_XMM1_Qb;
        auVar1._0_8_ = SVar17.values.values._8_8_;
        local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar1);
        auVar10 = ZEXT1664((undefined1  [16])local_68.values.values);
        SampledSpectrum::operator+=(&local_a0,&local_68);
        TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        uVar8 = local_78 + 1;
      }
      lVar9 = local_90 + 1;
    }
    SampledSpectrum::operator/=(&local_a0,(float)(TVar6.x * TVar6.y));
  }
  auVar16 = (undefined1  [56])0x0;
  SVar17 = SampledSpectrum::operator*
                     (&local_a0,
                      (Float)((uint)(this->twoSided & 1) * 0x40000000 +
                             (uint)!(bool)(this->twoSided & 1) * 0x3f800000));
  auVar13._0_8_ = SVar17.values.values._0_8_;
  auVar13._8_56_ = auVar16;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar17.values.values._8_8_;
  _local_b0 = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar2);
  auVar16 = (undefined1  [56])0x0;
  SVar17 = SampledSpectrum::operator*((SampledSpectrum *)local_b0,this->scale);
  auVar14._0_8_ = SVar17.values.values._0_8_;
  auVar14._8_56_ = auVar16;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar17.values.values._8_8_;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar3);
  auVar16 = (undefined1  [56])0x0;
  SVar17 = SampledSpectrum::operator*(&local_68,this->area);
  auVar15._0_8_ = SVar17.values.values._0_8_;
  auVar15._8_56_ = auVar16;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar17.values.values._8_8_;
  local_58._0_16_ = vmovlhps_avx(auVar15._0_16_,auVar4);
  SVar17 = SampledSpectrum::operator*((SampledSpectrum *)&local_58,3.1415927);
  return (array<float,_4>)(array<float,_4>)SVar17;
}

Assistant:

SampledSpectrum DiffuseAreaLight::Phi(const SampledWavelengths &lambda) const {
    SampledSpectrum phi(0.f);
    if (image) {
        // Compute average light image emission
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                RGB rgb;
                for (int c = 0; c < 3; ++c)
                    rgb[c] = image.GetChannel({x, y}, c);
                phi += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
            }
        phi /= image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.Sample(lambda);
    return phi * (twoSided ? 2 : 1) * scale * area * Pi;
}